

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

void __thiscall Semantic::SymbolTable::addClass(SymbolTable *this,string *className,Class *_class)

{
  mapped_type pCVar1;
  bool bVar2;
  DuplicateClassDecl *this_00;
  mapped_type *ppCVar3;
  string local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_true>
  local_28;
  mapped_type local_20;
  Class *_class_local;
  string *className_local;
  SymbolTable *this_local;
  
  local_20 = _class;
  _class_local = (Class *)className;
  className_local = (string *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
       ::find(&this->classes,className);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
       ::end(&this->classes);
  bVar2 = std::__detail::operator!=(&local_28,&local_30);
  pCVar1 = local_20;
  if (!bVar2) {
    ppCVar3 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
              ::operator[](&this->classes,(key_type *)_class_local);
    *ppCVar3 = pCVar1;
    return;
  }
  this_00 = (DuplicateClassDecl *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_50,(string *)_class_local);
  Err::DuplicateClassDecl::DuplicateClassDecl(this_00,&local_50);
  __cxa_throw(this_00,&Err::DuplicateClassDecl::typeinfo,
              Err::DuplicateClassDecl::~DuplicateClassDecl);
}

Assistant:

void Semantic::SymbolTable::addClass(std::string &className, Class *_class) {
    if (classes.find(className) != classes.end())
        throw Semantic::Err::DuplicateClassDecl(className);

    classes[className] = _class;
}